

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O3

void __thiscall
embree::sse2::BVHNMeshBuilderMorton<4,_embree::TriangleMesh,_embree::TriangleMv<4>_>::clear
          (BVHNMeshBuilderMorton<4,_embree::TriangleMesh,_embree::TriangleMv<4>_> *this)

{
  size_t sVar1;
  BuildPrim *ptr;
  MemoryMonitorInterface *pMVar2;
  
  sVar1 = (this->morton).size_alloced;
  ptr = (this->morton).items;
  if (ptr != (BuildPrim *)0x0) {
    if (sVar1 * 8 < 0x1c00000) {
      alignedFree(ptr);
    }
    else {
      os_free(ptr,sVar1 * 8,(this->morton).alloc.hugepages);
    }
  }
  if (sVar1 != 0) {
    pMVar2 = (this->morton).alloc.device;
    (**pMVar2->_vptr_MemoryMonitorInterface)(pMVar2,sVar1 * -8,1);
  }
  (this->morton).size_active = 0;
  (this->morton).size_alloced = 0;
  (this->morton).items = (BuildPrim *)0x0;
  return;
}

Assistant:

void clear() {
        morton.clear();
      }